

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall nv::Kernel1::Kernel1(Kernel1 *this,Filter *f,int iscale,int samples)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  float *pfVar4;
  float fVar5;
  int local_3c;
  int i_1;
  float inv;
  float sample;
  int i;
  float total;
  float offset;
  float scale;
  int samples_local;
  int iscale_local;
  Filter *f_local;
  Kernel1 *this_local;
  
  fVar5 = Filter::width(f);
  this->m_width = fVar5 * (float)iscale;
  fVar5 = ceilf(this->m_width * 2.0);
  this->m_windowSize = (int)fVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->m_windowSize;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  this->m_data = pfVar4;
  iVar1 = this->m_windowSize;
  sample = 0.0;
  for (inv = 0.0; (int)inv < this->m_windowSize; inv = (float)((int)inv + 1)) {
    fVar5 = Filter::sampleBox(f,(float)(int)inv - (float)iVar1 / 2.0,1.0 / (float)iscale,samples);
    this->m_data[(int)inv] = fVar5;
    sample = fVar5 + sample;
  }
  for (local_3c = 0; local_3c < this->m_windowSize; local_3c = local_3c + 1) {
    this->m_data[local_3c] = (1.0 / sample) * this->m_data[local_3c];
  }
  return;
}

Assistant:

Kernel1::Kernel1(const Filter & f, int iscale, int samples/*= 32*/)
{
	nvDebugCheck(iscale > 1);
	nvDebugCheck(samples > 0);
	
	const float scale = 1.0f / iscale;
	
	m_width = f.width() * iscale;
	m_windowSize = (int)ceilf(2 * m_width);
	m_data = new float[m_windowSize];
	
	const float offset = float(m_windowSize) / 2;
	
	float total = 0.0f;
	for (int i = 0; i < m_windowSize; i++)
	{
		const float sample = f.sampleBox(i - offset, scale, samples);
		m_data[i] = sample;
		total += sample;
	}
	
	const float inv = 1.0f / total;
	for (int i = 0; i < m_windowSize; i++)
	{
		m_data[i] *= inv;
	}
}